

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_TEXBEM(Context *ctx)

{
  size_t in_RCX;
  size_t in_RDX;
  char sampler [64];
  char src [64];
  char dst [64];
  char code [512];
  
  get_METAL_destarg_varname(ctx,dst,in_RDX);
  get_METAL_srcarg_varname(ctx,0,src,in_RCX);
  ctx->metal_need_header_texture = 1;
  snprintf(code,0x10,"%u",(ulong)(uint)(ctx->dest_arg).regnum);
  snprintf(sampler,0x40,"%s%s","s",code);
  make_METAL_destarg_assign
            (ctx,code,0x200,
             "%s_texture.sample(%s, float2(%s.x + (%s_texbem.x * %s.x) + (%s_texbem.z * %s.y), %s.y + (%s_texbem.y * %s.x) + (%s_texbem.w * %s.y)))"
             ,sampler,sampler,dst,sampler,src,sampler,src,dst,sampler,src,sampler,src);
  output_line(ctx,"%s",code);
  return;
}

Assistant:

static void emit_METAL_TEXBEM(Context *ctx)
{
    DestArgInfo *info = &ctx->dest_arg;
    char dst[64]; get_METAL_destarg_varname(ctx, dst, sizeof (dst));
    char src[64]; get_METAL_srcarg_varname(ctx, 0, src, sizeof (src));
    char sampler[64];
    char code[512];

    ctx->metal_need_header_texture = 1;

    // !!! FIXME: this code counts on the register not having swizzles, etc.
    get_METAL_varname_in_buf(ctx, REG_TYPE_SAMPLER, info->regnum,
                            sampler, sizeof (sampler));

    make_METAL_destarg_assign(ctx, code, sizeof (code),
        "%s_texture.sample(%s, float2(%s.x + (%s_texbem.x * %s.x) + (%s_texbem.z * %s.y),"
        " %s.y + (%s_texbem.y * %s.x) + (%s_texbem.w * %s.y)))",
        sampler, sampler,
        dst, sampler, src, sampler, src,
        dst, sampler, src, sampler, src);

    output_line(ctx, "%s", code);
}